

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_traits.hpp
# Opt level: O2

type jsoncons::unicode_traits::detect_encoding_from_bom<char>(char *data,size_t length)

{
  int iVar1;
  type tVar2;
  ulong uStack_10;
  
  if (length < 4) {
    if (1 < length) goto LAB_00193923;
  }
  else {
    if (*(int *)data == 0xfeff) {
      data = data + 4;
      uStack_10 = 4;
      goto LAB_00193973;
    }
    if (*(int *)data == -0x20000) {
      data = data + 4;
      uStack_10 = 5;
      goto LAB_00193973;
    }
LAB_00193923:
    if (*(short *)data == -0x101) {
      data = data + 2;
      uStack_10 = 2;
      goto LAB_00193973;
    }
    if (*(short *)data == -2) {
      data = data + 2;
      uStack_10 = 3;
      goto LAB_00193973;
    }
    if (2 < length) {
      iVar1 = bcmp(data,&DAT_00657bf0,3);
      uStack_10 = (ulong)(iVar1 == 0);
      data = data + uStack_10 * 3;
      goto LAB_00193973;
    }
  }
  uStack_10 = 0;
LAB_00193973:
  tVar2._8_8_ = uStack_10;
  tVar2.ptr = data;
  return tVar2;
}

Assistant:

typename std::enable_if<ext_traits::is_char8<CharT>::value,detect_encoding_result<CharT>>::type
    detect_encoding_from_bom(const CharT* data, std::size_t length)
    {
        const uint8_t bom_utf8[] = {0xef,0xbb,0xbf}; 
        const uint8_t bom_utf16le[] = {0xff,0xfe}; 
        const uint8_t bom_utf16be[] = {0xfe,0xff}; 
        const uint8_t bom_utf32le[] = {0xff,0xfe,0x00,0x00}; 
        const uint8_t bom_utf32be[] = {0x00,0x00,0xfe,0xff}; 

        if (length >= 4 && !memcmp(data,bom_utf32le,4))
        {
            return detect_encoding_result<CharT>{data+4,encoding_kind::utf32le};
        }
        else if (length >= 4 && !memcmp(data,bom_utf32be,4))
        {
            return detect_encoding_result<CharT>{data+4,encoding_kind::utf32be};
        }
        else if (length >= 2 && !memcmp(data,bom_utf16le,2))
        {
            return detect_encoding_result<CharT>{data+2,encoding_kind::utf16le};
        }
        else if (length >= 2 && !memcmp(data,bom_utf16be,2))
        {
            return detect_encoding_result<CharT>{data+2,encoding_kind::utf16be};
        }
        else if (length >= 3 && !memcmp(data,bom_utf8,3))
        {
            return detect_encoding_result<CharT>{data+3,encoding_kind::utf8};
        }
        else
        {
            return detect_encoding_result<CharT>{data,encoding_kind::undetected};
        }
    }